

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagemap.h
# Opt level: O0

bool __thiscall TCMalloc_PageMap2<35>::Ensure(TCMalloc_PageMap2<35> *this,Number start,size_t n)

{
  ulong uVar1;
  Leaf *__s;
  Leaf *leaf;
  Number i1;
  Number key;
  size_t n_local;
  Number start_local;
  TCMalloc_PageMap2<35> *this_local;
  
  i1 = start;
  while( true ) {
    if ((start + n) - 1 < i1) {
      return true;
    }
    uVar1 = i1 >> 0x12;
    if (0x1ffff < uVar1) break;
    if (this->root_[uVar1] == (Leaf *)0x0) {
      __s = (Leaf *)(*this->allocator_)(0x200000);
      if (__s == (Leaf *)0x0) {
        return false;
      }
      memset(__s,0,0x200000);
      this->root_[uVar1] = __s;
    }
    i1 = ((i1 >> 0x12) + 1) * 0x40000;
  }
  return false;
}

Assistant:

bool Ensure(Number start, size_t n) {
    for (Number key = start; key <= start + n - 1; ) {
      const Number i1 = key >> LEAF_BITS;

      // Check for overflow
      if (i1 >= ROOT_LENGTH)
        return false;

      // Make 2nd level node if necessary
      if (root_[i1] == nullptr) {
        Leaf* leaf = reinterpret_cast<Leaf*>((*allocator_)(sizeof(Leaf)));
        if (leaf == nullptr) return false;
        memset(leaf, 0, sizeof(*leaf));
        root_[i1] = leaf;
      }

      // Advance key past whatever is covered by this leaf node
      key = ((key >> LEAF_BITS) + 1) << LEAF_BITS;
    }
    return true;
  }